

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::writeBuffer(Samba *this,uint32_t src_addr,uint32_t dst_addr,uint32_t size)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  SambaError *pSVar4;
  pointer pSVar5;
  char local_78 [4];
  int l;
  uint8_t cmd [64];
  uint32_t size_local;
  uint32_t dst_addr_local;
  uint32_t src_addr_local;
  Samba *this_local;
  
  if ((this->_canWriteBuffer & 1U) == 0) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  uVar1 = checksumBufferSize(this);
  if (uVar1 < size) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_debug & 1U) != 0) {
    printf("%s(scr_addr=%#x, dst_addr=%#x, size=%#x)\n","writeBuffer",(ulong)src_addr,
           (ulong)dst_addr,(ulong)size);
  }
  uVar2 = snprintf(local_78,0x40,"Y%08X,0#",(ulong)src_addr);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  uVar3 = (*pSVar5->_vptr_SerialPort[6])(pSVar5,local_78,(ulong)uVar2);
  if (uVar3 != uVar2) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,100);
  local_78[0] = '\0';
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[5])(pSVar5,local_78,3);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,1000);
  if (local_78[0] != 'Y') {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  uVar2 = snprintf(local_78,0x40,"Y%08X,%08X#",(ulong)dst_addr,(ulong)size);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  uVar3 = (*pSVar5->_vptr_SerialPort[6])(pSVar5,local_78,(ulong)uVar2);
  if (uVar3 != uVar2) {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,5000);
  local_78[0] = '\0';
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[5])(pSVar5,local_78,3);
  pSVar5 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar5->_vptr_SerialPort[9])(pSVar5,1000);
  if (local_78[0] != 'Y') {
    pSVar4 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar4);
    __cxa_throw(pSVar4,&SambaError::typeinfo,SambaError::~SambaError);
  }
  return;
}

Assistant:

void
Samba::writeBuffer(uint32_t src_addr, uint32_t dst_addr, uint32_t size)
{
    if (!_canWriteBuffer)
        throw SambaError();

    if (size > checksumBufferSize())
        throw SambaError();
            
    if (_debug)
        printf("%s(scr_addr=%#x, dst_addr=%#x, size=%#x)\n", __FUNCTION__, src_addr, dst_addr, size);

    uint8_t cmd[64];
    int l = snprintf((char*) cmd, sizeof(cmd), "Y%08X,0#", src_addr);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_QUICK);
    cmd[0] = 0;
    _port->read(cmd, 3); // Expects "Y\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Y')
        throw SambaError();

    l = snprintf((char*) cmd, sizeof(cmd), "Y%08X,%08X#", dst_addr, size);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    cmd[0] = 0;
    _port->read(cmd, 3); // Expects "Y\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Y')
        throw SambaError();
}